

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexPointFilter::eval
          (PtexPointFilter *this,float *result,int firstchan,int nchannels,int faceid,float u,
          float v,float param_8,float param_9,float param_10,float param_11,float param_12,
          float param_13)

{
  int iVar1;
  int iVar2;
  Res *this_00;
  int in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int in_R8D;
  int vi;
  int ui;
  int resv;
  int resu;
  FaceInfo *f;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  
  if ((((*(long *)(in_RDI + 8) != 0) && (0 < in_ECX)) && (-1 < in_R8D)) &&
     (iVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x60))(), in_R8D < iVar1)) {
    this_00 = (Res *)(**(code **)(**(long **)(in_RDI + 8) + 0x80))(*(long **)(in_RDI + 8),in_R8D);
    Res::u(this_00);
    Res::v(this_00);
    iVar1 = PtexUtils::clamp<int>
                      (in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c
                      );
    iVar2 = PtexUtils::clamp<int>
                      (in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c
                      );
    (**(code **)(**(long **)(in_RDI + 8) + 0xa8))
              (*(long **)(in_RDI + 8),in_R8D,iVar1,iVar2,in_RSI,in_EDX,in_ECX);
  }
  return;
}

Assistant:

virtual void eval(float* result, int firstchan, int nchannels,
                      int faceid, float u, float v,
                      float /*uw1*/, float /*vw1*/, float /*uw2*/, float /*vw2*/,
                      float /*width*/, float /*blur*/)
    {
        if (!_tx || nchannels <= 0) return;
        if (faceid < 0 || faceid >= _tx->numFaces()) return;
        const FaceInfo& f = _tx->getFaceInfo(faceid);
        int resu = f.res.u(), resv = f.res.v();
        int ui = PtexUtils::clamp(int(u*(float)resu), 0, resu-1);
        int vi = PtexUtils::clamp(int(v*(float)resv), 0, resv-1);
        _tx->getPixel(faceid, ui, vi, result, firstchan, nchannels);
    }